

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdWin.c
# Opt level: O1

void Sbd_ManSolverPrint(Vec_Int_t *vSop)

{
  uint uVar1;
  long lVar2;
  int nVars;
  char Cube [65];
  int pInds [64];
  uint local_18c;
  byte local_188 [80];
  int local_138 [66];
  
  Sbd_ManSolverSupp(vSop,local_138,(int *)&local_18c);
  local_188[0x30] = 0;
  local_188[0x31] = 0;
  local_188[0x32] = 0;
  local_188[0x33] = 0;
  local_188[0x34] = 0;
  local_188[0x35] = 0;
  local_188[0x36] = 0;
  local_188[0x37] = 0;
  local_188[0x38] = 0;
  local_188[0x39] = 0;
  local_188[0x3a] = 0;
  local_188[0x3b] = 0;
  local_188[0x3c] = 0;
  local_188[0x3d] = 0;
  local_188[0x3e] = 0;
  local_188[0x3f] = 0;
  local_188[0x20] = 0;
  local_188[0x21] = 0;
  local_188[0x22] = 0;
  local_188[0x23] = 0;
  local_188[0x24] = 0;
  local_188[0x25] = 0;
  local_188[0x26] = 0;
  local_188[0x27] = 0;
  local_188[0x28] = 0;
  local_188[0x29] = 0;
  local_188[0x2a] = 0;
  local_188[0x2b] = 0;
  local_188[0x2c] = 0;
  local_188[0x2d] = 0;
  local_188[0x2e] = 0;
  local_188[0x2f] = 0;
  local_188[0x10] = 0;
  local_188[0x11] = 0;
  local_188[0x12] = 0;
  local_188[0x13] = 0;
  local_188[0x14] = 0;
  local_188[0x15] = 0;
  local_188[0x16] = 0;
  local_188[0x17] = 0;
  local_188[0x18] = 0;
  local_188[0x19] = 0;
  local_188[0x1a] = 0;
  local_188[0x1b] = 0;
  local_188[0x1c] = 0;
  local_188[0x1d] = 0;
  local_188[0x1e] = 0;
  local_188[0x1f] = 0;
  local_188[0] = 0;
  local_188[1] = 0;
  local_188[2] = 0;
  local_188[3] = 0;
  local_188[4] = 0;
  local_188[5] = 0;
  local_188[6] = 0;
  local_188[7] = 0;
  local_188[8] = 0;
  local_188[9] = 0;
  local_188[10] = 0;
  local_188[0xb] = 0;
  local_188[0xc] = 0;
  local_188[0xd] = 0;
  local_188[0xe] = 0;
  local_188[0xf] = 0;
  local_188[0x40] = 0;
  if (local_188[(int)local_18c] != 0) {
    __assert_fail("Cube[nVars] == \'\\0\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdWin.c"
                  ,0x15d,"void Sbd_ManSolverPrint(Vec_Int_t *)");
  }
  if (0 < (int)local_18c) {
    memset(local_188,0x2d,(long)(int)local_18c);
  }
  if (0 < vSop->nSize) {
    lVar2 = 0;
    do {
      uVar1 = vSop->pArray[lVar2];
      if (uVar1 == 0xffffffff) {
        puts((char *)local_188);
        if (0 < (int)local_18c) {
          memset(local_188,0x2d,(ulong)local_18c);
        }
      }
      else {
        if ((int)uVar1 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x130,"int Abc_LitIsCompl(int)");
        }
        local_188[local_138[uVar1 >> 1]] = (byte)uVar1 & 1 ^ 0x31;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < vSop->nSize);
  }
  return;
}

Assistant:

void Sbd_ManSolverPrint( Vec_Int_t * vSop )
{
    int v, i, Entry, nVars, pInds[64];
    word Supp = Sbd_ManSolverSupp( vSop, pInds, &nVars );
    char Cube[65] = {'\0'};
    assert( Cube[nVars] == '\0' );
    for ( v = 0; v < nVars; v++ )
        Cube[v] = '-';
    Vec_IntForEachEntry( vSop, Entry, i )
    {
        if ( Entry == -1 )
        {
            printf( "%s\n", Cube );
            for ( v = 0; v < nVars; v++ )
                Cube[v] = '-';
            continue;
        }
        Cube[pInds[Abc_Lit2Var(Entry)]] = '1' - (char)Abc_LitIsCompl(Entry);
    }
    Supp = 0;
}